

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayMethods.cpp
# Opt level: O0

ConstantValue * __thiscall
slang::ast::builtins::QueuePopMethod::eval
          (QueuePopMethod *this,EvalContext *context,Args *args,SourceRange param_4,
          SystemCallInfo *param_5)

{
  SourceRange range;
  undefined1 uVar1;
  bool bVar2;
  reference ppEVar3;
  Type *this_00;
  deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> *this_01;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *in_RCX;
  long in_RSI;
  ConstantValue *in_RDI;
  SVQueue *q;
  ConstantValue *target;
  LValue lval;
  ConstantValue *result;
  ConstantValue *in_stack_fffffffffffffda8;
  EvalContext *in_stack_fffffffffffffdb0;
  Type *in_stack_fffffffffffffdb8;
  deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> *in_stack_fffffffffffffdc0;
  LValue *in_stack_fffffffffffffdc8;
  EvalContext *this_02;
  undefined6 in_stack_fffffffffffffe00;
  undefined1 in_stack_fffffffffffffe07;
  undefined1 local_1b8 [440];
  
  local_1b8._392_8_ = in_RCX;
  std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[](in_RCX,0);
  this_02 = (EvalContext *)local_1b8;
  Expression::evalLValue((Expression *)in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0);
  uVar1 = LValue::operator_cast_to_bool((LValue *)0x1334cc1);
  if ((bool)uVar1) {
    LValue::resolve(in_stack_fffffffffffffdc8);
    slang::ConstantValue::queue((ConstantValue *)0x1334d49);
    CopyPtr<slang::SVQueue>::operator*((CopyPtr<slang::SVQueue> *)0x1334d5a);
    bVar2 = std::deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::empty
                      ((deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> *)
                       0x1334d6f);
    if (bVar2) {
      ppEVar3 = std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[]
                          ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)
                           local_1b8._392_8_,0);
      range.startLoc._6_1_ = uVar1;
      range.startLoc._0_6_ = in_stack_fffffffffffffe00;
      range.startLoc._7_1_ = in_stack_fffffffffffffe07;
      range.endLoc = ((*ppEVar3)->sourceRange).startLoc;
      EvalContext::addDiag(this_02,SUB84(((*ppEVar3)->sourceRange).endLoc,4),range);
      std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[]
                ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)
                 local_1b8._392_8_,0);
      not_null<const_slang::ast::Type_*>::operator->
                ((not_null<const_slang::ast::Type_*> *)0x1334de1);
      this_00 = Type::getArrayElementType(in_stack_fffffffffffffdb8);
      Type::getDefaultValue(this_00);
    }
    else {
      if ((*(byte *)(in_RSI + 0x38) & 1) == 0) {
        this_01 = (deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> *)
                  std::deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::back
                            (in_stack_fffffffffffffdc0);
      }
      else {
        this_01 = (deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> *)
                  std::deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::front
                            (in_stack_fffffffffffffdc0);
      }
      slang::ConstantValue::ConstantValue((ConstantValue *)this_01,in_stack_fffffffffffffda8);
      if ((*(byte *)(in_RSI + 0x38) & 1) == 0) {
        std::deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::pop_back(this_01);
      }
      else {
        std::deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::pop_front(this_01);
      }
    }
  }
  else {
    slang::ConstantValue::ConstantValue
              ((ConstantValue *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
  }
  LValue::~LValue((LValue *)0x1334eb6);
  return in_RDI;
}

Assistant:

ConstantValue eval(EvalContext& context, const Args& args, SourceRange,
                       const CallExpression::SystemCallInfo&) const final {
        auto lval = args[0]->evalLValue(context);
        if (!lval)
            return nullptr;

        auto target = lval.resolve();
        SLANG_ASSERT(target && target->isQueue());

        auto& q = *target->queue();
        if (q.empty()) {
            context.addDiag(diag::ConstEvalEmptyQueue, args[0]->sourceRange);
            return args[0]->type->getArrayElementType()->getDefaultValue();
        }

        ConstantValue result = front ? std::move(q.front()) : std::move(q.back());
        if (front)
            q.pop_front();
        else
            q.pop_back();

        return result;
    }